

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_maybe_block_port(sexp ctx,sexp in,int forcep)

{
  sexp psVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  sexp in_RSI;
  long in_RDI;
  int c;
  sexp f;
  int local_70;
  int local_68;
  uint local_58;
  uint local_54;
  sexp_conflict local_50;
  sexp_conflict in_stack_ffffffffffffffb8;
  sexp_conflict in_stack_ffffffffffffffc0;
  sexp_conflict f_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  
  if (((in_RSI->value).type.getters != (sexp)0x0) ||
     ((((in_RSI->value).string.length & 3) == 0 && (((in_RSI->value).type.slots)->tag == 0x12)))) {
    if ((in_RSI->value).type.getters == (sexp)0x0) {
      local_50 = in_stack_ffffffffffffffb8;
      local_58 = in_stack_ffffffffffffffd4;
      if ((((in_RSI->value).string.length & 3) == 0) && (((in_RSI->value).type.slots)->tag == 0x12))
      {
        in_stack_ffffffffffffffc0 = (sexp_conflict)(((in_RSI->value).type.slots)->value).fileno.fd;
        f_00 = in_stack_ffffffffffffffc0;
      }
      else {
        in_stack_ffffffffffffffc0 = (sexp_conflict)0xffffffffffffffff;
        f_00 = in_stack_ffffffffffffffc0;
      }
    }
    else {
      iVar2 = fileno((FILE *)(in_RSI->value).type.getters);
      local_50 = in_stack_ffffffffffffffb8;
      f_00 = (sexp_conflict)(long)iVar2;
      local_58 = in_stack_ffffffffffffffd4;
    }
    if (-1 < (long)f_00) {
      if ((in_RSI->value).type.finalize_name == (sexp)0xffffffffffffffff) {
        if ((in_RSI->value).type.getters == (sexp)0x0) {
          if ((((in_RSI->value).string.length & 3) == 0) &&
             (((in_RSI->value).type.slots)->tag == 0x12)) {
            local_50 = (sexp_conflict)(((in_RSI->value).type.slots)->value).fileno.fd;
          }
          else {
            local_50 = (sexp_conflict)0xffffffffffffffff;
          }
        }
        else {
          iVar2 = fileno((FILE *)(in_RSI->value).type.getters);
          local_50 = (sexp_conflict)(long)iVar2;
        }
        iVar2 = fcntl((int)local_50,3);
        *(long *)((long)&in_RSI->value + 0x40) = (long)iVar2;
      }
      if (((in_RSI->value).port.flags & 0x800) != 0) {
        if (in_EDX == 0) {
          if ((in_RSI->value).type.setters == (sexp)0x0) {
            local_58 = getc((FILE *)(in_RSI->value).type.getters);
          }
          else {
            if ((in_RSI->value).type.print < (sexp)(in_RSI->value).port.size) {
              psVar1 = (in_RSI->value).type.print;
              (in_RSI->value).type.print = (sexp)((long)&psVar1->tag + 1);
              local_54 = (uint)*(byte *)((long)&psVar1->tag +
                                        (long)&((in_RSI->value).type.setters)->tag);
            }
            else {
              local_54 = sexp_buffered_read_char(in_RSI,(sexp)(ulong)in_stack_ffffffffffffffe0);
            }
            local_58 = local_54;
          }
          if ((((local_58 == 0xffffffff) && ((in_RSI->value).type.getters != (sexp)0x0)) &&
              (((in_RSI->value).type.getters == (sexp)0x0 ||
               (iVar2 = ferror((FILE *)(in_RSI->value).type.getters), iVar2 != 0)))) &&
             (piVar3 = __errno_location(), *piVar3 == 0xb)) {
            if ((in_RSI->value).type.getters != (sexp)0x0) {
              clearerr((FILE *)(in_RSI->value).type.getters);
            }
            piVar3 = *(int **)(*(long *)(in_RDI + 0x28) + 0x198);
            if (((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x14)) ||
               ((((ulong)piVar3 & 3) == 0 && (*piVar3 == 0x1b)))) {
              sexp_apply2((sexp_conflict)CONCAT44(local_58,in_stack_ffffffffffffffd0),f_00,
                          in_stack_ffffffffffffffc0,local_50);
              return 1;
            }
          }
        }
        if ((in_EDX == 0) && (local_58 != 0xffffffff)) {
          if ((in_RSI->value).type.setters == (sexp)0x0) {
            ungetc(local_58,(FILE *)(in_RSI->value).type.getters);
          }
          else {
            psVar1 = (in_RSI->value).type.print;
            (in_RSI->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
            *(char *)(((in_RSI->value).bytecode.max_depth - 1) + (long)psVar1) = (char)local_58;
          }
        }
        (in_RSI->value).flonum_bits[0x2e] = '\x01';
        if ((in_RSI->value).type.getters == (sexp)0x0) {
          if ((((in_RSI->value).string.length & 3) == 0) &&
             (((in_RSI->value).type.slots)->tag == 0x12)) {
            local_70 = (int)(((in_RSI->value).type.slots)->value).string.offset;
          }
          else {
            local_70 = -1;
          }
          local_68 = local_70;
        }
        else {
          local_68 = fileno((FILE *)(in_RSI->value).type.getters);
        }
        fcntl(local_68,4,(in_RSI->value).port.flags & 0xfffffffffffff7ff);
      }
    }
  }
  return 0;
}

Assistant:

int sexp_maybe_block_port (sexp ctx, sexp in, int forcep) {
  sexp f;
  int c;
  if ((sexp_port_stream(in) || sexp_filenop(sexp_port_fd(in)))
      && sexp_port_fileno(in) >= 0) {
    if (sexp_port_flags(in) == SEXP_PORT_UNKNOWN_FLAGS)
      sexp_port_flags(in) = fcntl(sexp_port_fileno(in), F_GETFL);
    if (sexp_port_flags(in) & O_NONBLOCK) {
      if (!forcep
          && (((c = sexp_read_char(ctx, in)) == EOF)
              && sexp_port_stream(in)
              && (sexp_port_stream(in) ? ferror(sexp_port_stream(in)) : 1)
              && (errno == EAGAIN))) {
        if (sexp_port_stream(in))
          clearerr(sexp_port_stream(in));
        f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
        if (sexp_applicablep(f)) {
          sexp_apply2(ctx, f, in, SEXP_FALSE);
          return 1;
        }
      }
      if (!forcep) sexp_push_char(ctx, c, in);
      sexp_port_blockedp(in) = 1;
      fcntl(sexp_port_fileno(in), F_SETFL, sexp_port_flags(in) & ~O_NONBLOCK);
    }
  }
  return 0;
}